

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_ctx_recvmsg(nng_ctx cid,nng_msg **msgp,int flags)

{
  nng_msg *pnVar1;
  nni_ctx *local_1f0;
  nni_ctx *ctx;
  nni_aio aio;
  int rv;
  int flags_local;
  nng_msg **msgp_local;
  nng_ctx cid_local;
  
  aio.a_reap_node.rn_next._4_4_ = flags;
  aio.a_reap_node.rn_next._0_4_ = nni_ctx_find(&local_1f0,cid.id);
  msgp_local._4_4_ = (nng_err)aio.a_reap_node.rn_next;
  if ((nng_err)aio.a_reap_node.rn_next == NNG_OK) {
    nni_aio_init((nni_aio *)&ctx,(nni_cb)0x0,(void *)0x0);
    if ((aio.a_reap_node.rn_next._4_4_ & 2) == 0) {
      nng_aio_set_timeout((nng_aio *)&ctx,-2);
    }
    else {
      nng_aio_set_timeout((nng_aio *)&ctx,0);
    }
    nni_ctx_recv(local_1f0,(nni_aio *)&ctx);
    nni_ctx_rele(local_1f0);
    nni_aio_wait((nni_aio *)&ctx);
    aio.a_reap_node.rn_next._0_4_ = nni_aio_result((nni_aio *)&ctx);
    if ((nng_err)aio.a_reap_node.rn_next == NNG_OK) {
      pnVar1 = nng_aio_get_msg((nng_aio *)&ctx);
      *msgp = pnVar1;
    }
    else if (((nng_err)aio.a_reap_node.rn_next == NNG_ETIMEDOUT) &&
            ((aio.a_reap_node.rn_next._4_4_ & 2) == 2)) {
      aio.a_reap_node.rn_next._0_4_ = NNG_EAGAIN;
    }
    nni_aio_fini((nni_aio *)&ctx);
    msgp_local._4_4_ = (nng_err)aio.a_reap_node.rn_next;
  }
  return msgp_local._4_4_;
}

Assistant:

int
nng_ctx_recvmsg(nng_ctx cid, nng_msg **msgp, int flags)
{
	int      rv;
	nni_aio  aio;
	nni_ctx *ctx;

	if ((rv = nni_ctx_find(&ctx, cid.id)) != 0) {
		return (rv);
	}

	nni_aio_init(&aio, NULL, NULL);
	if (flags & NNG_FLAG_NONBLOCK) {
		nng_aio_set_timeout(&aio, NNG_DURATION_ZERO);
	} else {
		nng_aio_set_timeout(&aio, NNG_DURATION_DEFAULT);
	}
	nni_ctx_recv(ctx, &aio);
	nni_ctx_rele(ctx);

	nni_aio_wait(&aio);

	if ((rv = nni_aio_result(&aio)) == 0) {
		*msgp = nng_aio_get_msg(&aio);

	} else if ((rv == NNG_ETIMEDOUT) &&
	    ((flags & NNG_FLAG_NONBLOCK) == NNG_FLAG_NONBLOCK)) {
		rv = NNG_EAGAIN;
	}
	nni_aio_fini(&aio);

	return (rv);
}